

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O2

void av1_predict_intra_block_facade
               (AV1_COMMON *cm,MACROBLOCKD *xd,int plane,int blk_col,int blk_row,TX_SIZE tx_size)

{
  int ref_stride;
  MB_MODE_INFO *pMVar1;
  int angle_delta;
  SequenceHeader *pSVar2;
  FILTER_INTRA_MODE filter_intra_mode;
  PREDICTION_MODE *pPVar3;
  CFL_PRED_TYPE pred_plane;
  uint uVar4;
  uint8_t *ref;
  bool bVar5;
  bool bVar6;
  
  pMVar1 = *xd->mi;
  ref_stride = xd->plane[plane].dst.stride;
  if (plane == 0) {
    pPVar3 = &pMVar1->mode;
  }
  else {
    pPVar3 = get_uv_mode_uv2y + pMVar1->uv_mode;
  }
  ref = xd->plane[plane].dst.buf + (ref_stride * blk_row + blk_col) * 4;
  bVar5 = plane != 0;
  bVar6 = (pMVar1->palette_mode_info).palette_size[bVar5] != '\0';
  if (plane == 0) {
    if ((pMVar1->filter_intra_mode_info).use_filter_intra == '\0') {
      filter_intra_mode = '\x05';
    }
    else {
      filter_intra_mode = (pMVar1->filter_intra_mode_info).filter_intra_mode;
    }
    angle_delta = pMVar1->angle_delta[bVar5] * 3;
    pSVar2 = cm->seq_params;
  }
  else {
    angle_delta = pMVar1->angle_delta[bVar5] * 3;
    pSVar2 = cm->seq_params;
    filter_intra_mode = '\x05';
    if (pMVar1->uv_mode == '\r') {
      uVar4 = plane - 1U & 0xff;
      pred_plane = (CFL_PRED_TYPE)(plane - 1U);
      if ((xd->cfl).dc_pred_is_cached[uVar4] == false) {
        av1_predict_intra_block
                  (xd,pSVar2->sb_size,(uint)pSVar2->enable_intra_edge_filter,
                   (uint)xd->plane[plane].width,(uint)xd->plane[plane].height,tx_size,*pPVar3,
                   angle_delta,(uint)bVar6,'\x05',ref,ref_stride,ref,ref_stride,blk_col,blk_row,
                   plane);
        if ((xd->cfl).use_dc_pred_cache == true) {
          cfl_store_dc_pred(xd,ref,pred_plane,tx_size_wide[tx_size]);
          (xd->cfl).dc_pred_is_cached[uVar4] = true;
        }
      }
      else {
        cfl_load_dc_pred(xd,ref,ref_stride,tx_size,pred_plane);
      }
      av1_cfl_predict_block(xd,ref,ref_stride,tx_size,plane);
      return;
    }
  }
  av1_predict_intra_block
            (xd,pSVar2->sb_size,(uint)pSVar2->enable_intra_edge_filter,(uint)xd->plane[plane].width,
             (uint)xd->plane[plane].height,tx_size,*pPVar3,angle_delta,(uint)bVar6,filter_intra_mode
             ,ref,ref_stride,ref,ref_stride,blk_col,blk_row,plane);
  return;
}

Assistant:

void av1_predict_intra_block_facade(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                    int plane, int blk_col, int blk_row,
                                    TX_SIZE tx_size) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  struct macroblockd_plane *const pd = &xd->plane[plane];
  const int dst_stride = pd->dst.stride;
  uint8_t *dst = &pd->dst.buf[(blk_row * dst_stride + blk_col) << MI_SIZE_LOG2];
  const PREDICTION_MODE mode =
      (plane == AOM_PLANE_Y) ? mbmi->mode : get_uv_mode(mbmi->uv_mode);
  const int use_palette = mbmi->palette_mode_info.palette_size[plane != 0] > 0;
  const FILTER_INTRA_MODE filter_intra_mode =
      (plane == AOM_PLANE_Y && mbmi->filter_intra_mode_info.use_filter_intra)
          ? mbmi->filter_intra_mode_info.filter_intra_mode
          : FILTER_INTRA_MODES;
  const int angle_delta = mbmi->angle_delta[plane != AOM_PLANE_Y] * ANGLE_STEP;
  const SequenceHeader *seq_params = cm->seq_params;

#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
  if (plane != AOM_PLANE_Y && mbmi->uv_mode == UV_CFL_PRED) {
#if CONFIG_DEBUG
    assert(is_cfl_allowed(xd));
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(mbmi->bsize, pd->subsampling_x, pd->subsampling_y);
    (void)plane_bsize;
    assert(plane_bsize < BLOCK_SIZES_ALL);
    if (!xd->lossless[mbmi->segment_id]) {
      assert(blk_col == 0);
      assert(blk_row == 0);
      assert(block_size_wide[plane_bsize] == tx_size_wide[tx_size]);
      assert(block_size_high[plane_bsize] == tx_size_high[tx_size]);
    }
#endif
    CFL_CTX *const cfl = &xd->cfl;
    CFL_PRED_TYPE pred_plane = get_cfl_pred_type(plane);
    if (!cfl->dc_pred_is_cached[pred_plane]) {
      av1_predict_intra_block(xd, seq_params->sb_size,
                              seq_params->enable_intra_edge_filter, pd->width,
                              pd->height, tx_size, mode, angle_delta,
                              use_palette, filter_intra_mode, dst, dst_stride,
                              dst, dst_stride, blk_col, blk_row, plane);
      if (cfl->use_dc_pred_cache) {
        cfl_store_dc_pred(xd, dst, pred_plane, tx_size_wide[tx_size]);
        cfl->dc_pred_is_cached[pred_plane] = true;
      }
    } else {
      cfl_load_dc_pred(xd, dst, dst_stride, tx_size, pred_plane);
    }
    av1_cfl_predict_block(xd, dst, dst_stride, tx_size, plane);
    return;
  }
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
  av1_predict_intra_block(
      xd, seq_params->sb_size, seq_params->enable_intra_edge_filter, pd->width,
      pd->height, tx_size, mode, angle_delta, use_palette, filter_intra_mode,
      dst, dst_stride, dst, dst_stride, blk_col, blk_row, plane);
}